

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulation.c
# Opt level: O2

int simulateFluid(double **U,double **V,double **P,bndCond *bCond,lattice *grid,fluidSim *sim,
                 MPI_Comm Region,double t_end,char *problem,int opt)

{
  char **ppcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  lattice *grid_00;
  double *buf1;
  double *buf2;
  fluidSim *pfVar4;
  double **ppdVar5;
  double **ppdVar6;
  double dVar7;
  double **ppdVar8;
  double **ppdVar9;
  ulong uVar10;
  double *pdVar11;
  int iVar12;
  double dVar13;
  double adStack_f0 [3];
  double dStack_d8;
  lattice *local_d0;
  double *local_c8;
  double *local_c0;
  undefined1 *local_b8;
  double local_b0;
  double dt;
  double **local_a0;
  double local_98;
  uint local_8c;
  double local_88;
  ulong local_80;
  fluidSim *local_78;
  double **local_70;
  double **local_68;
  double **local_60;
  double local_58;
  double **local_50;
  int local_44;
  double dStack_40;
  int rank;
  double delt;
  
  local_80 = 0;
  if ((P != (double **)0x0 && (V != (double **)0x0 && U != (double **)0x0)) &&
     (sim != (fluidSim *)0x0 && (grid != (lattice *)0x0 && bCond != (bndCond *)0x0))) {
    adStack_f0[2] = 5.23530238762281e-318;
    dt = (double)bCond;
    local_78 = sim;
    local_58 = t_end;
    local_50 = V;
    delt = (double)U;
    ppdVar8 = create2Dfield(grid->deli + 1,grid->delj + 1);
    adStack_f0[2] = 5.23541108206489e-318;
    ppdVar9 = create2Dfield(grid->deli + 1,grid->delj + 1);
    adStack_f0[2] = 5.23550001388115e-318;
    local_a0 = create2Dfield(grid->deli,grid->delj);
    if (local_a0 != (double **)0x0 && (ppdVar9 != (double **)0x0 && ppdVar8 != (double **)0x0)) {
      adStack_f0[2] = 5.2358260972074e-318;
      local_70 = ppdVar8;
      local_68 = ppdVar9;
      local_60 = P;
      MPI_Comm_rank(Region,&local_44);
      ppdVar8 = (double **)delt;
      local_b0 = 0.0;
      dStack_40 = local_78->dt;
      iVar12 = grid->deli;
      if (grid->deli < grid->delj) {
        iVar12 = grid->delj;
      }
      local_b8 = (undefined1 *)&dStack_d8;
      uVar10 = (ulong)(iVar12 + 3) * 8 + 0xf & 0xfffffffffffffff0;
      local_c8 = (double *)((long)&dStack_d8 - uVar10);
      pdVar11 = (double *)((long)local_c8 - uVar10);
      local_c0 = pdVar11;
      if (opt < 0x10) {
        local_98 = local_58 + local_58;
      }
      else {
        local_98 = local_58 / (double)((uint)opt >> 4);
      }
      if (local_44 == 0) {
        dVar13 = local_78->Re;
        pdVar11[-1] = 5.23672035602637e-318;
        printf("Computing %s with Reynolds-number %lg.\n",dVar13,problem);
      }
      else {
        opt = opt & 0xfffffffe;
      }
      pdVar11[-1] = 4.94065645841247e-324;
      uVar10 = (ulong)pdVar11[-1] & 0xffffffff;
      dVar13 = 0.0;
      local_d0 = grid;
      local_8c = opt;
      while (ppdVar5 = local_50, ppdVar9 = local_60, grid_00 = local_d0, local_80 = uVar10,
            dVar13 <= local_58) {
        local_88 = dVar13;
        if ((local_8c & 1) != 0) {
          pdVar11[-1] = 5.23708102394784e-318;
          printf("Time is at %lg seconds\n",dVar13);
        }
        ppdVar6 = local_50;
        dVar13 = dt;
        pdVar11[-1] = 5.23723418429805e-318;
        setBCond(ppdVar8,ppdVar6,grid_00,(bndCond *)dVar13);
        pdVar11[-1] = 5.2373231161143e-318;
        setSpecBCond(ppdVar8,ppdVar6,grid_00,problem);
        dVar7 = dStack_40;
        ppdVar5 = local_68;
        ppdVar9 = local_70;
        pfVar4 = local_78;
        ppcVar1 = *(char ***)((long)dVar13 + 8);
        pdVar11[-2] = (double)local_78;
        pdVar11[-3] = 5.2375602676243e-318;
        compFG(ppdVar8,ppdVar6,ppdVar9,ppdVar5,ppcVar1,dVar7,grid_00,(fluidSim *)pdVar11[-2]);
        dVar7 = dStack_40;
        ppdVar8 = local_a0;
        pdVar11[-1] = 5.23771342797451e-318;
        compRHS(ppdVar9,ppdVar5,ppdVar8,grid_00,dVar7);
        ppdVar5 = local_60;
        buf2 = local_c0;
        buf1 = local_c8;
        ppcVar1 = *(char ***)((long)dVar13 + 8);
        pdVar11[-1] = (double)Region;
        pdVar11[-2] = (double)grid_00;
        pdVar11[-3] = 5.23796046079744e-318;
        solveSORforPoisson(ppdVar5,ppdVar8,ppcVar1,buf1,buf2,pfVar4,(lattice *)pdVar11[-2],
                           (MPI_Comm)pdVar11[-1]);
        dVar7 = delt;
        dVar13 = dStack_40;
        ppdVar6 = local_50;
        ppdVar9 = local_68;
        ppdVar8 = local_70;
        pdVar11[-2] = (double)*(undefined8 *)((long)dt + 8);
        pdVar11[-3] = 5.23821243427681e-318;
        adaptUV((double **)dVar7,ppdVar6,ppdVar5,ppdVar8,ppdVar9,dVar13,grid_00,(char **)pdVar11[-2]
               );
        pdVar11[-2] = 9.88131291682493e-324;
        uVar2 = pdVar11[-2];
        pdVar11[-2] = 4.94065645841247e-324;
        uVar3 = pdVar11[-2];
        pdVar11[-2] = (double)Region;
        pdVar11[-3] = 5.23838535725286e-318;
        exchangeMat((double **)dVar7,(int)uVar2,(int)uVar3,buf1,buf2,grid_00,(MPI_Comm)pdVar11[-2]);
        ppdVar9 = local_50;
        pdVar11[-2] = 4.94065645841247e-324;
        uVar2 = pdVar11[-2];
        pdVar11[-2] = 9.88131291682493e-324;
        uVar3 = pdVar11[-2];
        pdVar11[-2] = (double)Region;
        pdVar11[-3] = 5.2385582802289e-318;
        exchangeMat(ppdVar9,(int)uVar2,(int)uVar3,buf1,buf2,grid_00,(MPI_Comm)pdVar11[-2]);
        dVar13 = delt;
        pfVar4 = local_78;
        pdVar11[-1] = 5.23867685598391e-318;
        local_b0 = compDelt(grid_00,(double **)dVar13,ppdVar9,pfVar4);
        ppdVar8 = local_60;
        iVar12 = (int)local_80;
        uVar10 = local_80;
        if ((double)iVar12 * local_98 < local_88) {
          pdVar11[-1] = 5.23898317668433e-318;
          dumpFields(Region,(double **)dVar13,ppdVar9,ppdVar8,grid_00,iVar12 + -1);
          uVar10 = (ulong)(iVar12 + 1);
        }
        pdVar11[-1] = 4.94065645841247e-324;
        uVar2 = pdVar11[-1];
        pdVar11[-1] = 5.23918080294266e-318;
        MPI_Allreduce(&local_b0,&stack0xffffffffffffffc0,uVar2,&ompi_mpi_double,&ompi_mpi_op_min,
                      Region);
        ppdVar8 = (double **)delt;
        dVar13 = local_88 + dStack_40;
      }
      if (0xf < (int)local_8c) {
        pdVar11[-1] = 5.23950688626892e-318;
        dumpFields(Region,ppdVar8,ppdVar5,ppdVar9,grid_00,(int)uVar10 + -1);
      }
      if (local_44 == 0) {
        pdVar11[-1] = 5.23959581808517e-318;
        puts("[Simulation complete!]");
      }
      ppdVar8 = local_70;
      iVar12 = grid_00->deli;
      pdVar11[-1] = 5.2396748685885e-318;
      destroy2Dfield(ppdVar8,iVar12 + 1);
      ppdVar8 = local_68;
      iVar12 = grid_00->deli;
      pdVar11[-1] = 5.23975391909184e-318;
      destroy2Dfield(ppdVar8,iVar12 + 1);
      ppdVar8 = local_a0;
      iVar12 = grid_00->deli;
      pdVar11[-1] = 5.23983791025163e-318;
      destroy2Dfield(ppdVar8,iVar12);
    }
  }
  return (int)local_80;
}

Assistant:

int simulateFluid (REAL **U, REAL **V, REAL **P,
		bndCond* bCond, lattice *grid, fluidSim *sim, MPI_Comm Region,
		REAL t_end, const char *problem, int opt)
{
	/* Simulate the fluid characterized by sim, grid and bCond */
	/* Error checking */
	if (!U || !V|| !P)
		return 0;
	if (!bCond || !grid || !sim)
		return 0;
	/* Auxiliary Grids:
	   RHS is used for the Poisson-Solver so no ghost cells are neccessary */
	REAL **F = create2Dfield(grid->deli+1,grid->delj+1);
	REAL **G = create2Dfield(grid->deli+1,grid->delj+1);
	REAL **RHS = create2Dfield(grid->deli,grid->delj);
	if (!F || !G || !RHS)
		return 0;
	int n, rank;
	MPI_Comm_rank(Region,&rank);
	REAL del_vec, dt = 0, delt = sim->dt;

	n = grid->deli;
	if (grid->delj > n)
		n = grid->delj;
	REAL buf1[n+3], buf2[n+3];
	n = 1;
	if (opt >= OUTPUT)
		del_vec = t_end/(opt/OUTPUT);
	else
		del_vec = t_end*2;
	/* Begin the simulation */
	if (rank == 0)
		printf("Computing %s with Reynolds-number %lg.\n",problem,sim->Re);
	else
		opt -= opt&PRINT;
	for (REAL time = 0; time <= t_end; time += delt)
	{
		if (opt & PRINT)
			printf("Time is at %lg seconds\n",time);
		/* Update all parameters and fields for the iteration */
		setBCond(U,V,grid,bCond);
		setSpecBCond(U,V,grid,problem);
		compFG(U,V,F,G,bCond->FLAG,delt,grid,sim);
		compRHS(F,G,RHS,grid,delt);

		/* Solve the Poisson Equation */
		solveSORforPoisson(P,RHS,bCond->FLAG,buf1,buf2,sim,grid, Region);
		/* Update U and V through F,G and P */
		adaptUV(U,V,P,F,G,delt,grid,bCond->FLAG);
		exchangeMat(U,2,1,buf1,buf2,grid,Region);
		exchangeMat(V,1,2,buf1,buf2,grid,Region);
		dt = compDelt(grid,U,V,sim);

		if (time > del_vec*n)
		{
			dumpFields(Region,U,V,P,grid,n-1);
			n++;
		}
		MPI_Allreduce(&dt,&delt,1,MPI_DOUBLE,MPI_MIN,Region);
	}
	if (opt >= OUTPUT)
		dumpFields(Region,U,V,P,grid,n-1);
	if (rank == 0)
		printf("[Simulation complete!]\n");

	/* Destroy non-simulated grids */
	destroy2Dfield((void**)F,grid->deli+1);
	destroy2Dfield((void**)G,grid->deli+1);
	destroy2Dfield((void**)RHS,grid->deli);
	return n;
}